

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O1

void absl::lts_20250127::str_format_internal::anon_unknown_0::
     RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
               (Buffer *buffer,int *exp)

{
  char *pcVar1;
  ushort *puVar2;
  bool bVar3;
  
  puVar2 = (ushort *)buffer->end;
  if (puVar2 <= buffer->begin) {
    __assert_fail("begin < end",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x3fc,
                  "char &absl::str_format_internal::(anonymous namespace)::Buffer::back() const");
  }
  pcVar1 = (char *)((long)puVar2 + -1);
  bVar3 = pcVar1 < buffer->begin;
  if (!bVar3) {
    do {
      if (*pcVar1 != '.') {
        if (*pcVar1 != '9') {
          if (!bVar3) {
            *pcVar1 = *pcVar1 + '\x01';
            return;
          }
          break;
        }
        *pcVar1 = '0';
      }
      pcVar1 = pcVar1 + -1;
      bVar3 = pcVar1 < buffer->begin;
    } while (!bVar3);
    puVar2 = (ushort *)(pcVar1 + 1);
  }
  *pcVar1 = '1';
  buffer->begin = pcVar1;
  *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
  *exp = *exp + 1;
  if (buffer->begin < buffer->end) {
    buffer->end = buffer->end + -1;
    return;
  }
  __assert_fail("begin < end",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                ,0x3f7,"void absl::str_format_internal::(anonymous namespace)::Buffer::pop_back()");
}

Assistant:

void RoundUp(Buffer *buffer, int *exp) {
  char *p = &buffer->back();
  while (p >= buffer->begin && (*p == '9' || *p == '.')) {
    if (*p == '9') *p = '0';
    --p;
  }

  if (p < buffer->begin) {
    *p = '1';
    buffer->begin = p;
    if (mode == FormatStyle::Precision) {
      std::swap(p[1], p[2]);  // move the .
      ++*exp;
      buffer->pop_back();
    }
  } else {
    ++*p;
  }
}